

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

qsizetype __thiscall
QResourcePrivate::decompress(QResourcePrivate *this,char *buffer,qsizetype bufferSize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  QMessageLogger *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t usize;
  int res;
  uLong len;
  char *in_stack_ffffffffffffff68;
  int line;
  undefined4 in_stack_ffffffffffffff78;
  QMessageLogger *in_stack_ffffffffffffff80;
  QMessageLogger *local_58;
  QMessageLogger local_50;
  QMessageLogger local_30;
  QMessageLogger *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (uint)*(byte *)(in_RDI + 0x80);
  if ((uVar1 == 0) || (uVar1 == 1)) {
    local_10 = in_RDX;
    uVar2 = uncompress(in_RSI,&local_10,*(long *)(in_RDI + 0x60) + 4,*(long *)(in_RDI + 0x50) + -4);
    if (uVar2 == 0) {
      local_58 = local_10;
    }
    else {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff80,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff78),
                 (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff68);
      QMessageLogger::warning
                (&local_30,"QResource: error decompressing zlib content (%d)",(ulong)uVar2);
      local_58 = (QMessageLogger *)0xffffffffffffffff;
    }
  }
  else if (uVar1 == 2) {
    local_58 = (QMessageLogger *)
               ZSTD_decompress(in_RSI,in_RDX,*(undefined8 *)(in_RDI + 0x60),
                               *(undefined8 *)(in_RDI + 0x50));
    line = (int)((ulong)in_RDI >> 0x20);
    iVar3 = ZSTD_isError(local_58);
    if (iVar3 != 0) {
      QMessageLogger::QMessageLogger
                (local_58,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff78),line,
                 in_stack_ffffffffffffff68);
      uVar4 = ZSTD_getErrorName(local_58);
      QMessageLogger::warning(&local_50,"QResource: error decompressing zstd content: %s",uVar4);
      local_58 = (QMessageLogger *)0xffffffffffffffff;
    }
  }
  else {
    local_58 = (QMessageLogger *)0xffffffffffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (qsizetype)local_58;
}

Assistant:

qsizetype QResourcePrivate::decompress(char *buffer, qsizetype bufferSize) const
{
    Q_ASSERT(data);
#if defined(QT_NO_COMPRESS) && !QT_CONFIG(zstd)
    Q_UNUSED(buffer);
    Q_UNUSED(bufferSize);
#endif

    switch (compressionAlgo) {
    case QResource::NoCompression:
        Q_UNREACHABLE();
        break;

    case QResource::ZlibCompression: {
#ifndef QT_NO_COMPRESS
        uLong len = uLong(bufferSize);
        int res = ::uncompress(reinterpret_cast<Bytef *>(buffer), &len, data + sizeof(quint32),
                               uLong(size - sizeof(quint32)));
        if (res != Z_OK) {
            qWarning("QResource: error decompressing zlib content (%d)", res);
            return -1;
        }
        return len;
#else
        Q_UNREACHABLE();
#endif
    }

    case QResource::ZstdCompression: {
#if QT_CONFIG(zstd)
        size_t usize = ZSTD_decompress(buffer, bufferSize, data, size);
        if (ZSTD_isError(usize)) {
            qWarning("QResource: error decompressing zstd content: %s", ZSTD_getErrorName(usize));
            return -1;
        }
        return usize;
#else
        Q_UNREACHABLE();
#endif
    }
    }

    return -1;
}